

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

String * __thiscall
capnp::JsonCodec::encodeRaw(String *__return_storage_ptr__,JsonCodec *this,Reader value)

{
  bool multiline;
  bool local_49;
  StringTree local_48;
  
  local_49 = false;
  Impl::encodeRaw(&local_48,(this->impl).ptr,value,0,&local_49,false);
  kj::StringTree::flatten(__return_storage_ptr__,&local_48);
  kj::StringTree::~StringTree(&local_48);
  return __return_storage_ptr__;
}

Assistant:

kj::String JsonCodec::encodeRaw(JsonValue::Reader value) const {
  bool multiline = false;
  return impl->encodeRaw(value, 0, multiline, false).flatten();
}